

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O2

Aig_Man_t * Aig_ManDupCof(Aig_Man_t *p,int iInput,int Value)

{
  uint uVar1;
  Aig_Man_t *p_00;
  char *pcVar2;
  Vec_Int_t *pVVar3;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *p1;
  int iVar7;
  
  if (p->pManTime != (void *)0x0) {
    __assert_fail("p->pManTime == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDup.c"
                  ,0x15e,"Aig_Man_t *Aig_ManDupCof(Aig_Man_t *, int, int)");
  }
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar2;
  iVar7 = p->nConstrs;
  p_00->nAsserts = p->nAsserts;
  p_00->nConstrs = iVar7;
  p_00->nBarBufs = p->nBarBufs;
  if (p->vFlopNums != (Vec_Int_t *)0x0) {
    pVVar3 = Vec_IntDup(p->vFlopNums);
    p_00->vFlopNums = pVVar3;
  }
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  for (iVar7 = 0; iVar7 < p->vCis->nSize; iVar7 = iVar7 + 1) {
    pvVar4 = Vec_PtrEntry(p->vCis,iVar7);
    if (iInput == iVar7) {
      pAVar5 = p_00->pConst1;
      if (Value == 0) {
        pAVar5 = (Aig_Obj_t *)((ulong)pAVar5 ^ 1);
      }
    }
    else {
      pAVar5 = Aig_ObjCreateCi(p_00);
      *(ulong *)&pAVar5->field_0x18 =
           *(ulong *)&pAVar5->field_0x18 & 0xff000000ffffffff |
           *(ulong *)((long)pvVar4 + 0x18) & 0xffffff00000000;
    }
    *(Aig_Obj_t **)((long)pvVar4 + 0x28) = pAVar5;
  }
  iVar7 = 0;
  do {
    if (p->vObjs->nSize <= iVar7) {
      for (iVar7 = 0; iVar7 < p->vCos->nSize; iVar7 = iVar7 + 1) {
        pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar7);
        pAVar6 = Aig_ObjChild0Copy(pAVar5);
        pAVar6 = Aig_ObjCreateCo(p_00,pAVar6);
        (pAVar5->field_5).pData = pAVar6;
      }
      Aig_ManCleanup(p_00);
      Aig_ManSetRegNum(p_00,p->nRegs);
      iVar7 = Aig_ManCheck(p_00);
      if (iVar7 == 0) {
        puts("Aig_ManDupSimple(): The check has failed.");
      }
      return p_00;
    }
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar7);
    if (pAVar5 != (Aig_Obj_t *)0x0) {
      uVar1 = (uint)*(undefined8 *)&pAVar5->field_0x18;
      if ((uVar1 & 7) == 4) {
        pAVar6 = Aig_ObjChild0Copy(pAVar5);
      }
      else {
        if ((uVar1 & 7) - 7 < 0xfffffffe) goto LAB_00575226;
        pAVar6 = Aig_ObjChild0Copy(pAVar5);
        p1 = Aig_ObjChild1Copy(pAVar5);
        pAVar6 = Aig_And(p_00,pAVar6,p1);
      }
      (pAVar5->field_5).pData = pAVar6;
    }
LAB_00575226:
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

Aig_Man_t * Aig_ManDupCof( Aig_Man_t * p, int iInput, int Value )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew = NULL;
    int i;
    assert( p->pManTime == NULL );
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nAsserts = p->nAsserts;
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    if ( p->vFlopNums )
        pNew->vFlopNums = Vec_IntDup( p->vFlopNums );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
    {
        if ( i == iInput )
            pObjNew = Value ? Aig_ManConst1(pNew) : Aig_ManConst0(pNew);
        else
        {
            pObjNew = Aig_ObjCreateCi( pNew );
            pObjNew->Level = pObj->Level;
        }
        pObj->pData = pObjNew;
    }
    // duplicate internal nodes
    Aig_ManForEachObj( p, pObj, i )
        if ( Aig_ObjIsBuf(pObj) )
        {
            pObjNew = Aig_ObjChild0Copy(pObj);
            pObj->pData = pObjNew;
        }
        else if ( Aig_ObjIsNode(pObj) )
        {
            pObjNew = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
            pObj->pData = pObjNew;
        }
    // add the POs
    Aig_ManForEachCo( p, pObj, i )
    {
        pObjNew = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
        pObj->pData = pObjNew;
    }
//    assert( Aig_ManBufNum(p) != 0 || Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew) );
    Aig_ManCleanup( pNew );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupSimple(): The check has failed.\n" );
    return pNew;
}